

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_modules.cpp
# Opt level: O0

void module1(uint W)

{
  code *pcVar1;
  byte extraout_AL;
  byte extraout_AL_00;
  byte extraout_AL_01;
  byte extraout_AL_02;
  FlowBuilder *this;
  Enum EVar2;
  Enum EVar3;
  uint in_EDI;
  double __x;
  double __x_00;
  double __x_01;
  double __x_02;
  Expression_lhs<const_int_&> EVar4;
  ResultBuilder DOCTEST_RB_3;
  int n_1;
  ResultBuilder DOCTEST_RB_2;
  int n;
  Task m1_2;
  ResultBuilder DOCTEST_RB_1;
  ResultBuilder DOCTEST_RB;
  Task m1_1;
  Taskflow f1;
  Task E;
  Task D;
  Task C;
  Task B;
  Task A;
  int cnt;
  Taskflow f0;
  Executor executor;
  Task *in_stack_fffffffffffff828;
  tuple<tf::Task,_tf::Task,_tf::Task,_tf::Task,_tf::Task> *__in;
  Result *pRVar5;
  undefined4 in_stack_fffffffffffff830;
  undefined4 uVar6;
  undefined4 in_stack_fffffffffffff834;
  Executor *in_stack_fffffffffffff838;
  undefined4 in_stack_fffffffffffff840;
  Enum in_stack_fffffffffffff844;
  Executor *in_stack_fffffffffffff848;
  Enum EVar7;
  undefined4 in_stack_fffffffffffff850;
  undefined4 in_stack_fffffffffffff854;
  undefined4 in_stack_fffffffffffff860;
  undefined4 uVar8;
  undefined4 in_stack_fffffffffffff864;
  anon_class_8_1_ba1d3cc9 *in_stack_fffffffffffff868;
  anon_class_8_1_ba1d3cc9 *in_stack_fffffffffffff870;
  Taskflow *object;
  anon_class_8_1_ba1d3cc9 *cs;
  undefined4 in_stack_fffffffffffff888;
  undefined4 in_stack_fffffffffffff88c;
  anon_class_8_1_ba1d3cc9 *in_stack_fffffffffffff8a0;
  undefined4 in_stack_fffffffffffff8b0;
  undefined4 in_stack_fffffffffffff8b4;
  Expression_lhs<const_int_&> *in_stack_fffffffffffff8b8;
  undefined8 in_stack_fffffffffffff918;
  undefined8 in_stack_fffffffffffff920;
  undefined8 in_stack_fffffffffffff928;
  int local_690;
  ExpressionDecomposer local_674;
  Executor *local_670;
  Enum local_668;
  ResultBuilder local_640;
  int local_5a4;
  undefined4 local_594;
  int *local_590;
  Enum local_588;
  ExpressionDecomposer local_57c;
  int *local_578;
  Enum local_570;
  ResultBuilder local_548;
  undefined4 local_4ac;
  int *local_4a8;
  Enum local_4a0;
  ExpressionDecomposer local_494;
  int *local_490;
  Enum local_488;
  ResultBuilder local_460;
  undefined1 local_3c0 [56];
  __pthread_internal_list *local_388;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_380 [16];
  __pthread_internal_list *local_280;
  __pthread_internal_list *local_270;
  __pthread_internal_list *local_260;
  __pthread_internal_list *local_250;
  __pthread_internal_list *local_240;
  __pthread_internal_list local_22c [13];
  anon_class_8_1_ba1d3cc9 local_150 [42];
  
  this = (FlowBuilder *)(ulong)in_EDI;
  cs = local_150;
  std::shared_ptr<tf::WorkerInterface>::shared_ptr
            ((shared_ptr<tf::WorkerInterface> *)
             CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),in_stack_fffffffffffff828
            );
  tf::Executor::Executor
            ((Executor *)in_stack_fffffffffffff928,in_stack_fffffffffffff920,
             (shared_ptr<tf::WorkerInterface> *)in_stack_fffffffffffff918);
  std::shared_ptr<tf::WorkerInterface>::~shared_ptr((shared_ptr<tf::WorkerInterface> *)0x116ed6);
  tf::Taskflow::Taskflow((Taskflow *)CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850));
  local_22c[0].__prev._0_4_ = 0;
  local_240 = local_22c;
  tf::FlowBuilder::
  emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_modules_cpp:18:23),_nullptr>
            (this,in_stack_fffffffffffff870);
  local_250 = local_22c;
  tf::FlowBuilder::
  emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_modules_cpp:19:23),_nullptr>
            (this,in_stack_fffffffffffff870);
  local_260 = local_22c;
  tf::FlowBuilder::
  emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_modules_cpp:20:23),_nullptr>
            (this,in_stack_fffffffffffff870);
  local_270 = local_22c;
  tf::FlowBuilder::
  emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_modules_cpp:21:23),_nullptr>
            (this,in_stack_fffffffffffff870);
  local_280 = local_22c;
  tf::FlowBuilder::
  emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_modules_cpp:22:23),_nullptr>
            (this,in_stack_fffffffffffff870);
  tf::Task::precede<tf::Task&>
            ((Task *)CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),
             in_stack_fffffffffffff828);
  tf::Task::precede<tf::Task&>
            ((Task *)CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),
             in_stack_fffffffffffff828);
  tf::Task::precede<tf::Task&>
            ((Task *)CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),
             in_stack_fffffffffffff828);
  tf::Task::precede<tf::Task&>
            ((Task *)CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),
             in_stack_fffffffffffff828);
  tf::Taskflow::Taskflow((Taskflow *)CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850));
  local_3c0._40_8_ = local_22c;
  __in = (tuple<tf::Task,_tf::Task,_tf::Task,_tf::Task,_tf::Task> *)(local_3c0 + 0x28);
  local_3c0._48_8_ = local_3c0._40_8_;
  local_388 = (__pthread_internal_list *)local_3c0._40_8_;
  local_380[0]._0_8_ = local_3c0._40_8_;
  local_380[0]._8_8_ = local_3c0._40_8_;
  tf::FlowBuilder::
  emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_modules_cpp:33:5),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_modules_cpp:34:5),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_modules_cpp:35:5),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_modules_cpp:36:5),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_modules_cpp:37:5),_nullptr>
            ((FlowBuilder *)CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888),cs,
             (anon_class_8_1_ba1d3cc9 *)this,in_stack_fffffffffffff870,in_stack_fffffffffffff868,
             in_stack_fffffffffffff8a0);
  object = (Taskflow *)local_3c0;
  std::tie<tf::Task,tf::Task,tf::Task,tf::Task,tf::Task>
            ((Task *)in_stack_fffffffffffff848,
             (Task *)CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840),
             (Task *)in_stack_fffffffffffff838,
             (Task *)CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),(Task *)__in);
  std::tuple<tf::Task&,tf::Task&,tf::Task&,tf::Task&,tf::Task&>::operator=
            ((tuple<tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&> *)
             CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),__in);
  tf::Task::precede<tf::Task&>
            ((Task *)CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),(Task *)__in);
  tf::Task::precede<tf::Task&>
            ((Task *)CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),(Task *)__in);
  tf::Task::precede<tf::Task&>
            ((Task *)CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),(Task *)__in);
  tf::Task::precede<tf::Task&>
            ((Task *)CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),(Task *)__in);
  tf::FlowBuilder::composed_of<tf::Taskflow>(this,object);
  tf::Task::precede<tf::Task&>
            ((Task *)CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),(Task *)__in);
  tf::Executor::run(in_stack_fffffffffffff838,
                    (Taskflow *)CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830));
  std::future<void>::get
            ((future<void> *)CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
  tf::Future<void>::~Future
            ((Future<void> *)CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830));
  pRVar5 = (Result *)0x19c880;
  doctest::detail::ResultBuilder::ResultBuilder
            ((ResultBuilder *)CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850),
             (Enum)((ulong)in_stack_fffffffffffff848 >> 0x20),
             (char *)CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840),
             (int)((ulong)in_stack_fffffffffffff838 >> 0x20),
             (char *)CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),"",
             (char *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860));
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_494,DT_REQUIRE);
  EVar4 = doctest::detail::ExpressionDecomposer::operator<<<int,_nullptr>
                    ((ExpressionDecomposer *)
                     CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),(int *)pRVar5);
  local_4a8 = EVar4.lhs;
  EVar2 = EVar4.m_at;
  local_4ac = 10;
  local_4a0 = EVar2;
  local_490 = local_4a8;
  local_488 = EVar2;
  doctest::detail::Expression_lhs<int_const&>::operator==
            (in_stack_fffffffffffff8b8,
             (int *)CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0));
  doctest::detail::ResultBuilder::setResult
            ((ResultBuilder *)CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),pRVar5);
  doctest::detail::Result::~Result((Result *)0x1172c2);
  doctest::detail::ResultBuilder::log(&local_460,__x);
  uVar8 = CONCAT13(extraout_AL,(int3)in_stack_fffffffffffff860);
  if ((extraout_AL & 1) != 0) {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  doctest::detail::ResultBuilder::react
            ((ResultBuilder *)CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830));
  doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x11742f);
  local_22c[0].__prev._0_4_ = 0;
  tf::Executor::run_n(in_stack_fffffffffffff848,
                      (Taskflow *)CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840),
                      (size_t)in_stack_fffffffffffff838);
  std::future<void>::get
            ((future<void> *)CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
  tf::Future<void>::~Future
            ((Future<void> *)CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830));
  pRVar5 = (Result *)0x19c880;
  doctest::detail::ResultBuilder::ResultBuilder
            ((ResultBuilder *)CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850),
             (Enum)((ulong)in_stack_fffffffffffff848 >> 0x20),
             (char *)CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840),
             (int)((ulong)in_stack_fffffffffffff838 >> 0x20),
             (char *)CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),"",
             (char *)CONCAT44(EVar2,uVar8));
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_57c,DT_REQUIRE);
  EVar4 = doctest::detail::ExpressionDecomposer::operator<<<int,_nullptr>
                    ((ExpressionDecomposer *)
                     CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),(int *)pRVar5);
  local_590 = EVar4.lhs;
  EVar3 = EVar4.m_at;
  local_594 = 1000;
  local_588 = EVar3;
  local_578 = local_590;
  local_570 = EVar3;
  doctest::detail::Expression_lhs<int_const&>::operator==
            (in_stack_fffffffffffff8b8,
             (int *)CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0));
  doctest::detail::ResultBuilder::setResult
            ((ResultBuilder *)CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),pRVar5);
  doctest::detail::Result::~Result((Result *)0x117568);
  doctest::detail::ResultBuilder::log(&local_548,__x_00);
  uVar6 = CONCAT13(extraout_AL_00,(int3)in_stack_fffffffffffff850);
  if ((extraout_AL_00 & 1) != 0) {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  doctest::detail::ResultBuilder::react
            ((ResultBuilder *)CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830));
  doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x117676);
  tf::FlowBuilder::composed_of<tf::Taskflow>(this,object);
  tf::Task::precede<tf::Task&>
            ((Task *)CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),(Task *)pRVar5);
  for (local_5a4 = 0; local_5a4 < 100; local_5a4 = local_5a4 + 1) {
    local_22c[0].__prev._0_4_ = 0;
    tf::Executor::run_n(in_stack_fffffffffffff848,
                        (Taskflow *)CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840),
                        (size_t)in_stack_fffffffffffff838);
    EVar7 = (Enum)((ulong)in_stack_fffffffffffff848 >> 0x20);
    std::future<void>::get
              ((future<void> *)CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
    tf::Future<void>::~Future
              ((Future<void> *)CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830));
    pRVar5 = (Result *)0x19c880;
    doctest::detail::ResultBuilder::ResultBuilder
              ((ResultBuilder *)CONCAT44(EVar3,uVar6),EVar7,
               (char *)CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840),
               (int)((ulong)in_stack_fffffffffffff838 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),"",
               (char *)CONCAT44(EVar2,uVar8));
    doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_674,DT_REQUIRE);
    EVar4 = doctest::detail::ExpressionDecomposer::operator<<<int,_nullptr>
                      ((ExpressionDecomposer *)
                       CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),(int *)pRVar5);
    in_stack_fffffffffffff848 = (Executor *)EVar4.lhs;
    in_stack_fffffffffffff844 = EVar4.m_at;
    local_670 = in_stack_fffffffffffff848;
    local_668 = in_stack_fffffffffffff844;
    doctest::detail::Expression_lhs<int_const&>::operator==
              (in_stack_fffffffffffff8b8,
               (int *)CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0));
    doctest::detail::ResultBuilder::setResult
              ((ResultBuilder *)CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),pRVar5
              );
    doctest::detail::Result::~Result((Result *)0x11780e);
    doctest::detail::ResultBuilder::log(&local_640,__x_01);
    in_stack_fffffffffffff840 = CONCAT13(extraout_AL_01,(int3)in_stack_fffffffffffff840);
    if ((extraout_AL_01 & 1) != 0) {
      pcVar1 = (code *)swi(3);
      (*pcVar1)();
      return;
    }
    doctest::detail::ResultBuilder::react
              ((ResultBuilder *)CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830));
    doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x117916);
  }
  local_22c[0].__prev._0_4_ = 0;
  for (local_690 = 0; EVar7 = (Enum)((ulong)in_stack_fffffffffffff848 >> 0x20), local_690 < 100;
      local_690 = local_690 + 1) {
    tf::Executor::run(in_stack_fffffffffffff838,
                      (Taskflow *)CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830));
    tf::Future<void>::~Future
              ((Future<void> *)CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830));
  }
  tf::Executor::wait_for_all((Executor *)CONCAT44(EVar2,uVar8));
  pRVar5 = (Result *)0x19c880;
  doctest::detail::ResultBuilder::ResultBuilder
            ((ResultBuilder *)CONCAT44(EVar3,uVar6),EVar7,
             (char *)CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840),
             (int)((ulong)in_stack_fffffffffffff838 >> 0x20),
             (char *)CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),"",
             (char *)CONCAT44(EVar2,uVar8));
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer
            ((ExpressionDecomposer *)&stack0xfffffffffffff8a4,DT_REQUIRE);
  EVar4 = doctest::detail::ExpressionDecomposer::operator<<<int,_nullptr>
                    ((ExpressionDecomposer *)
                     CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),(int *)pRVar5);
  EVar3 = EVar4.m_at;
  doctest::detail::Expression_lhs<int_const&>::operator==
            (in_stack_fffffffffffff8b8,(int *)CONCAT44(in_stack_fffffffffffff8b4,EVar3));
  doctest::detail::ResultBuilder::setResult
            ((ResultBuilder *)CONCAT44(EVar3,in_stack_fffffffffffff830),pRVar5);
  doctest::detail::Result::~Result((Result *)0x117a86);
  doctest::detail::ResultBuilder::log((ResultBuilder *)&stack0xfffffffffffff8d8,__x_02);
  uVar6 = CONCAT13(extraout_AL_02,(int3)in_stack_fffffffffffff830);
  if ((extraout_AL_02 & 1) == 0) {
    doctest::detail::ResultBuilder::react((ResultBuilder *)CONCAT44(EVar3,uVar6));
    doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x117b53);
    tf::Taskflow::~Taskflow((Taskflow *)CONCAT44(EVar3,uVar6));
    tf::Taskflow::~Taskflow((Taskflow *)CONCAT44(EVar3,uVar6));
    tf::Executor::~Executor((Executor *)CONCAT44(EVar2,uVar8));
    return;
  }
  pcVar1 = (code *)swi(3);
  (*pcVar1)();
  return;
}

Assistant:

void module1(unsigned W) {

  tf::Executor executor(W);

  tf::Taskflow f0;

  int cnt {0};

  auto A = f0.emplace([&cnt](){ ++cnt; });
  auto B = f0.emplace([&cnt](){ ++cnt; });
  auto C = f0.emplace([&cnt](){ ++cnt; });
  auto D = f0.emplace([&cnt](){ ++cnt; });
  auto E = f0.emplace([&cnt](){ ++cnt; });

  A.precede(B);
  B.precede(C);
  C.precede(D);
  D.precede(E);

  tf::Taskflow f1;

  // module 1
  std::tie(A, B, C, D, E) = f1.emplace(
    [&cnt] () { ++cnt; },
    [&cnt] () { ++cnt; },
    [&cnt] () { ++cnt; },
    [&cnt] () { ++cnt; },
    [&cnt] () { ++cnt; }
  );
  A.precede(B);
  B.precede(C);
  C.precede(D);
  D.precede(E);
  auto m1_1 = f1.composed_of(f0);
  E.precede(m1_1);

  executor.run(f1).get();
  REQUIRE(cnt == 10);

  cnt = 0;
  executor.run_n(f1, 100).get();
  REQUIRE(cnt == 10 * 100);

  auto m1_2 = f1.composed_of(f0);
  m1_1.precede(m1_2);

  for(int n=0; n<100; n++) {
    cnt = 0;
    executor.run_n(f1, n).get();
    REQUIRE(cnt == 15*n);
  }

  cnt = 0;
  for(int n=0; n<100; n++) {
    executor.run(f1);
  }

  executor.wait_for_all();

  REQUIRE(cnt == 1500);
}